

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *r;
  int *piVar2;
  int iVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  uint32_t uVar7;
  long lVar8;
  uint count;
  uint uVar9;
  ulong uVar10;
  secp256k1_gej *__src;
  secp256k1_ge *psVar11;
  ulong uVar12;
  secp256k1_ge *a_00;
  secp256k1_gej *__src_00;
  secp256k1_gej *psVar13;
  ulong uVar14;
  secp256k1_ge *psVar15;
  ulong uVar16;
  secp256k1_ge *r_00;
  ulong uVar17;
  uint uVar18;
  secp256k1_fe *psVar19;
  bool bVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auStack_518 [56];
  ulong uStack_4e0;
  ulong uStack_4d8;
  ulong uStack_4d0;
  ulong uStack_4c8;
  ulong uStack_4c0;
  secp256k1_ge sStack_4b8;
  secp256k1_ge *psStack_450;
  undefined1 auStack_448 [56];
  uint64_t uStack_410;
  uint64_t uStack_408;
  uint64_t uStack_400;
  uint64_t uStack_3f8;
  int iStack_3f0;
  secp256k1_ge sStack_3d8;
  secp256k1_ge sStack_368;
  secp256k1_gej sStack_2f8;
  secp256k1_fe *psStack_260;
  secp256k1_ge *psStack_258;
  secp256k1_fe *psStack_250;
  secp256k1_ge *psStack_248;
  secp256k1_fe *psStack_240;
  secp256k1_ge *psStack_238;
  undefined1 auStack_228 [92];
  int iStack_1cc;
  secp256k1_ge sStack_1c8;
  secp256k1_fe sStack_160;
  secp256k1_fe sStack_130;
  secp256k1_gej *psStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_fe *psStack_e8;
  undefined1 *puStack_e0;
  secp256k1_fe *psStack_d8;
  secp256k1_fe *psStack_d0;
  secp256k1_gej sStack_c8;
  
  bVar21 = 0;
  __src_00 = &sStack_c8;
  psVar13 = &sStack_c8;
  psStack_d0 = (secp256k1_fe *)0x14ead2;
  memcpy(&sStack_c8,a,0x98);
  psStack_d0 = (secp256k1_fe *)0x14eada;
  secp256k1_gej_verify(&sStack_c8);
  psStack_d0 = (secp256k1_fe *)0x14eae2;
  secp256k1_gej_verify(b);
  psStack_d0 = (secp256k1_fe *)0x14eaef;
  secp256k1_fe_cmov(&sStack_c8.x,&b->x,0);
  psVar1 = &b->y;
  psStack_d0 = (secp256k1_fe *)0x14eb02;
  secp256k1_fe_cmov(&sStack_c8.y,psVar1,0);
  r = &sStack_c8.z;
  psVar19 = &b->z;
  psStack_d0 = (secp256k1_fe *)0x14eb18;
  secp256k1_fe_cmov(r,psVar19,0);
  psStack_d0 = (secp256k1_fe *)0x14eb20;
  secp256k1_gej_verify(&sStack_c8);
  psStack_d0 = (secp256k1_fe *)0x14eb2b;
  __src = a;
  iVar5 = gej_xyz_equals_gej(&sStack_c8,a);
  if (iVar5 == 0) {
    psStack_d0 = (secp256k1_fe *)0x14ebc2;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_d0 = (secp256k1_fe *)0x14eb3e;
    secp256k1_gej_verify(&sStack_c8);
    psStack_d0 = (secp256k1_fe *)0x14eb46;
    secp256k1_gej_verify(b);
    psStack_d0 = (secp256k1_fe *)0x14eb56;
    secp256k1_fe_cmov(&sStack_c8.x,&b->x,1);
    psStack_d0 = (secp256k1_fe *)0x14eb68;
    secp256k1_fe_cmov(&sStack_c8.y,psVar1,1);
    psStack_d0 = (secp256k1_fe *)0x14eb78;
    secp256k1_fe_cmov(r,psVar19,1);
    sStack_c8.infinity = sStack_c8.infinity & 0xfffffffeU | b->infinity & 1U;
    psStack_d0 = (secp256k1_fe *)0x14eb9c;
    secp256k1_gej_verify(&sStack_c8);
    psStack_d0 = (secp256k1_fe *)0x14eba7;
    __src = b;
    iVar5 = gej_xyz_equals_gej(&sStack_c8,b);
    __src_00 = psVar13;
    if (iVar5 != 0) {
      return;
    }
  }
  psStack_d0 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_d0 = psVar19;
  psStack_d8 = psVar1;
  puStack_e0 = (undefined1 *)&sStack_c8;
  psStack_e8 = r;
  psStack_f0 = a;
  psStack_f8 = b;
  if ((*(int *)((long)__src_00 + 0x90) != __src->infinity) || (*(int *)((long)__src_00 + 0x90) != 0)
     ) {
    return;
  }
  psVar1 = (secp256k1_fe *)(sStack_1c8.y.n + 1);
  psStack_238 = (secp256k1_ge *)0x14ec14;
  memcpy(psVar1,__src_00,0x98);
  psVar11 = (secp256k1_ge *)auStack_228;
  psStack_238 = (secp256k1_ge *)0x14ec29;
  memcpy(psVar11,__src,0x98);
  psStack_238 = (secp256k1_ge *)0x14ec31;
  secp256k1_fe_normalize(psVar1);
  psVar19 = &sStack_160;
  psStack_238 = (secp256k1_ge *)0x14ec41;
  secp256k1_fe_normalize(psVar19);
  psStack_238 = (secp256k1_ge *)0x14ec51;
  secp256k1_fe_normalize(&sStack_130);
  psStack_238 = (secp256k1_ge *)0x14ec59;
  secp256k1_fe_normalize((secp256k1_fe *)psVar11);
  psVar15 = (secp256k1_ge *)(auStack_228 + 0x30);
  psStack_238 = (secp256k1_ge *)0x14ec66;
  secp256k1_fe_normalize((secp256k1_fe *)psVar15);
  psStack_238 = (secp256k1_ge *)0x14ec73;
  secp256k1_fe_normalize(&sStack_1c8.x);
  psStack_238 = (secp256k1_ge *)0x14ec7b;
  secp256k1_fe_verify(psVar1);
  psStack_238 = (secp256k1_ge *)0x14ec83;
  a_00 = psVar11;
  secp256k1_fe_verify((secp256k1_fe *)psVar11);
  if (sStack_1c8._100_4_ == 0) {
    psStack_238 = (secp256k1_ge *)0x14ed88;
    gej_xyz_equals_gej_cold_6();
LAB_0014ed88:
    psStack_238 = (secp256k1_ge *)0x14ed8d;
    gej_xyz_equals_gej_cold_5();
LAB_0014ed8d:
    psStack_238 = (secp256k1_ge *)0x14ed92;
    gej_xyz_equals_gej_cold_4();
LAB_0014ed92:
    psStack_238 = (secp256k1_ge *)0x14ed97;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (auStack_228._44_4_ == 0) goto LAB_0014ed88;
    uVar6 = 4;
    do {
      uVar14 = *(ulong *)(auStack_228 + (ulong)uVar6 * 8);
      uVar10 = sStack_1c8.y.n[(ulong)uVar6 + 1];
      if (uVar10 >= uVar14 && uVar10 != uVar14) {
        psVar11 = (secp256k1_ge *)0x1;
        goto LAB_0014ecc5;
      }
      if (uVar10 < uVar14) {
        psVar11 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ecc5;
      }
      bVar20 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar20);
    psVar11 = (secp256k1_ge *)0x0;
LAB_0014ecc5:
    psStack_238 = (secp256k1_ge *)0x14eccd;
    secp256k1_fe_verify(psVar19);
    psStack_238 = (secp256k1_ge *)0x14ecd5;
    a_00 = psVar15;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    if (sStack_160.normalized == 0) goto LAB_0014ed8d;
    if (iStack_1cc == 0) goto LAB_0014ed92;
    uVar6 = 4;
    do {
      uVar14 = *(ulong *)(auStack_228 + (ulong)uVar6 * 8 + 0x30);
      uVar10 = sStack_160.n[uVar6];
      if (uVar10 >= uVar14 && uVar10 != uVar14) {
        psVar19 = (secp256k1_fe *)0x1;
        goto LAB_0014ed1e;
      }
      if (uVar10 < uVar14) {
        psVar19 = (secp256k1_fe *)0xffffffff;
        goto LAB_0014ed1e;
      }
      bVar20 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar20);
    psVar19 = (secp256k1_fe *)0x0;
LAB_0014ed1e:
    psStack_238 = (secp256k1_ge *)0x14ed26;
    secp256k1_fe_verify(&sStack_130);
    psStack_238 = (secp256k1_ge *)0x14ed2e;
    a_00 = &sStack_1c8;
    secp256k1_fe_verify(&sStack_1c8.x);
    if (sStack_130.normalized != 0) {
      if (sStack_1c8.x.normalized != 0) {
        uVar6 = 4;
        do {
          if (sStack_130.n[uVar6] != sStack_1c8.x.n[uVar6]) {
            return;
          }
          bVar20 = uVar6 != 0;
          uVar6 = uVar6 - 1;
        } while (bVar20);
        return;
      }
      goto LAB_0014ed9c;
    }
  }
  psStack_238 = (secp256k1_ge *)0x14ed9c;
  gej_xyz_equals_gej_cold_2();
LAB_0014ed9c:
  psStack_238 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_00 = &sStack_3d8;
  psStack_450 = a_00;
  psStack_260 = &sStack_130;
  psStack_258 = psVar15;
  psStack_250 = psVar1;
  psStack_248 = &sStack_1c8;
  psStack_240 = psVar19;
  psStack_238 = psVar11;
  secp256k1_ge_from_storage(r_00,(secp256k1_ge_storage *)a_00);
  iVar5 = secp256k1_ge_is_valid_var(r_00);
  if (iVar5 != 0) {
    secp256k1_gej_set_ge(&sStack_2f8,&sStack_3d8);
    secp256k1_gej_double_var(&sStack_2f8,&sStack_2f8,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_448,&sStack_2f8);
    sStack_4b8._96_8_ = 0x40;
    while( true ) {
      psVar15 = (secp256k1_ge *)(auStack_448 + 0x30);
      secp256k1_fe_verify(&sStack_3d8.x);
      psVar11 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_3d8.x,1);
      auStack_518._0_8_ = 0x3ffffbfffff0bc - sStack_3d8.x.n[0];
      auStack_518._8_8_ = 0x3ffffffffffffc - sStack_3d8.x.n[1];
      auStack_518._16_8_ = 0x3ffffffffffffc - sStack_3d8.x.n[2];
      auStack_518._24_8_ = 0x3ffffffffffffc - sStack_3d8.x.n[3];
      auStack_518._32_8_ = 0x3fffffffffffc - sStack_3d8.x.n[4];
      auStack_518._40_4_ = 2;
      auStack_518._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_518);
      secp256k1_fe_verify((secp256k1_fe *)auStack_518);
      r_00 = (secp256k1_ge *)auStack_448;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < (int)(auStack_448._40_4_ + auStack_518._40_4_)) break;
      auStack_518._0_8_ = auStack_518._0_8_ + auStack_448._0_8_;
      auStack_518._8_8_ = auStack_518._8_8_ + auStack_448._8_8_;
      auStack_518._16_8_ = auStack_518._16_8_ + auStack_448._16_8_;
      auStack_518._24_8_ = auStack_518._24_8_ + auStack_448._24_8_;
      auStack_518._32_8_ = auStack_518._32_8_ + auStack_448._32_8_;
      auStack_518._44_4_ = 0;
      auStack_518._40_4_ = auStack_448._40_4_ + auStack_518._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)auStack_518);
      secp256k1_fe_verify((secp256k1_fe *)auStack_518);
      auStack_518._0_8_ = ((ulong)auStack_518._32_8_ >> 0x30) * 0x1000003d1 + auStack_518._0_8_;
      auStack_518._8_8_ = ((ulong)auStack_518._0_8_ >> 0x34) + auStack_518._8_8_;
      auStack_518._16_8_ = ((ulong)auStack_518._8_8_ >> 0x34) + auStack_518._16_8_;
      uVar14 = ((ulong)auStack_518._16_8_ >> 0x34) + auStack_518._24_8_;
      auStack_518._24_8_ = uVar14 & 0xfffffffffffff;
      auStack_518._32_8_ = (uVar14 >> 0x34) + (auStack_518._32_8_ & 0xffffffffffff);
      auStack_518._16_8_ = auStack_518._16_8_ & 0xfffffffffffff;
      auStack_518._8_8_ = auStack_518._8_8_ & 0xfffffffffffff;
      auStack_518._0_8_ = auStack_518._0_8_ & 0xfffffffffffff;
      auStack_518._40_4_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_518);
      secp256k1_fe_verify(&sStack_3d8.y);
      psVar11 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_3d8.y,1);
      auStack_518._48_8_ = 0x3ffffbfffff0bc - sStack_3d8.y.n[0];
      uStack_4e0 = 0x3ffffffffffffc - sStack_3d8.y.n[1];
      uStack_4d8 = 0x3ffffffffffffc - sStack_3d8.y.n[2];
      uStack_4d0 = 0x3ffffffffffffc - sStack_3d8.y.n[3];
      uStack_4c8 = 0x3fffffffffffc - sStack_3d8.y.n[4];
      uStack_4c0._0_4_ = 2;
      uStack_4c0._4_4_ = 0;
      psVar1 = (secp256k1_fe *)(auStack_518 + 0x30);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)psVar15);
      r_00 = psVar15;
      if (0x20 < iStack_3f0 + (int)uStack_4c0) goto LAB_0014f663;
      auStack_518._48_8_ = auStack_518._48_8_ + auStack_448._48_8_;
      uStack_4e0 = uStack_4e0 + uStack_410;
      uStack_4d8 = uStack_4d8 + uStack_408;
      uStack_4d0 = uStack_4d0 + uStack_400;
      uStack_4c8 = uStack_4c8 + uStack_3f8;
      uStack_4c0 = (ulong)(uint)(iStack_3f0 + (int)uStack_4c0);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      auStack_518._48_8_ = (uStack_4c8 >> 0x30) * 0x1000003d1 + auStack_518._48_8_;
      uStack_4e0 = ((ulong)auStack_518._48_8_ >> 0x34) + uStack_4e0;
      uStack_4d8 = (uStack_4e0 >> 0x34) + uStack_4d8;
      uVar14 = (uStack_4d8 >> 0x34) + uStack_4d0;
      uStack_4d0 = uVar14 & 0xfffffffffffff;
      uStack_4c8 = (uVar14 >> 0x34) + (uStack_4c8 & 0xffffffffffff);
      uStack_4d8 = uStack_4d8 & 0xfffffffffffff;
      uStack_4e0 = uStack_4e0 & 0xfffffffffffff;
      auStack_518._48_8_ = auStack_518._48_8_ & 0xfffffffffffff;
      uStack_4c0 = CONCAT44(uStack_4c0._4_4_,1);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)auStack_518);
      uVar14 = ((ulong)auStack_518._32_8_ >> 0x30) * 0x1000003d1 + auStack_518._0_8_;
      if (((uVar14 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar14 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar14 >> 0x34) + auStack_518._8_8_;
        uVar12 = (uVar10 >> 0x34) + auStack_518._16_8_;
        uVar16 = (uVar12 >> 0x34) + auStack_518._24_8_;
        uVar17 = (uVar16 >> 0x34) + (auStack_518._32_8_ & 0xffffffffffff);
        if ((((uVar10 | uVar14 | uVar12 | uVar16) & 0xfffffffffffff) != 0 || uVar17 != 0) &&
           ((uVar14 + 0x1000003d0 & uVar10 & uVar12 & uVar16 & (uVar17 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f267;
        secp256k1_fe_verify(psVar1);
        uVar14 = (uStack_4c8 >> 0x30) * 0x1000003d1 + auStack_518._48_8_;
        if (((uVar14 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar14 & 0xfffffffffffff) != 0))
        goto LAB_0014f267;
        uVar10 = (uVar14 >> 0x34) + uStack_4e0;
        a_00 = (secp256k1_ge *)((uVar10 >> 0x34) + uStack_4d8);
        r_00 = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + uStack_4d0);
        uVar12 = ((ulong)r_00 >> 0x34) + (uStack_4c8 & 0xffffffffffff);
        if ((((uVar10 | uVar14 | (ulong)a_00 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar12 != 0)
           && ((uVar14 + 0x1000003d0 & uVar10 & (ulong)a_00 & (ulong)r_00 &
               (uVar12 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014f267;
        goto LAB_0014f681;
      }
LAB_0014f267:
      psVar11 = (secp256k1_ge *)((long)(psStack_450->x).n + sStack_4b8._96_8_);
      secp256k1_ge_from_storage(&sStack_368,(secp256k1_ge_storage *)psVar11);
      r_00 = &sStack_368;
      iVar5 = secp256k1_ge_is_valid_var(&sStack_368);
      if (iVar5 == 0) goto LAB_0014f668;
      secp256k1_fe_verify(&sStack_368.x);
      psVar11 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_368.x,1);
      sStack_4b8.y.n[0] = 0x3ffffbfffff0bc - sStack_368.x.n[0];
      sStack_4b8.y.n[1] = 0x3ffffffffffffc - sStack_368.x.n[1];
      sStack_4b8.y.n[2] = 0x3ffffffffffffc - sStack_368.x.n[2];
      sStack_4b8.y.n[3] = 0x3ffffffffffffc - sStack_368.x.n[3];
      sStack_4b8.y.n[4] = 0x3fffffffffffc - sStack_368.x.n[4];
      sStack_4b8.y.magnitude = 2;
      sStack_4b8.y.normalized = 0;
      psVar1 = &sStack_4b8.y;
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      r_00 = (secp256k1_ge *)auStack_448;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < auStack_448._40_4_ + sStack_4b8.y.magnitude) goto LAB_0014f66d;
      sStack_4b8.y.n[0] = sStack_4b8.y.n[0] + auStack_448._0_8_;
      sStack_4b8.y.n[1] = sStack_4b8.y.n[1] + auStack_448._8_8_;
      sStack_4b8.y.n[2] = sStack_4b8.y.n[2] + auStack_448._16_8_;
      sStack_4b8.y.n[3] = sStack_4b8.y.n[3] + auStack_448._24_8_;
      sStack_4b8.y.n[4] = sStack_4b8.y.n[4] + auStack_448._32_8_;
      sStack_4b8.y.normalized = 0;
      sStack_4b8.y.magnitude = auStack_448._40_4_ + sStack_4b8.y.magnitude;
      secp256k1_fe_verify(psVar1);
      sStack_4b8.x.n[4] = sStack_368.y.n[4];
      sStack_4b8.x.magnitude = sStack_368.y.magnitude;
      sStack_4b8.x.normalized = sStack_368.y.normalized;
      sStack_4b8.x.n[2] = sStack_368.y.n[2];
      sStack_4b8.x.n[3] = sStack_368.y.n[3];
      sStack_4b8.x.n[0] = sStack_368.y.n[0];
      sStack_4b8.x.n[1] = sStack_368.y.n[1];
      secp256k1_fe_verify(&sStack_4b8.x);
      r_00 = (secp256k1_ge *)(auStack_448 + 0x30);
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < iStack_3f0 + sStack_4b8.x.magnitude) goto LAB_0014f672;
      sStack_4b8.x.n[0] = sStack_4b8.x.n[0] + auStack_448._48_8_;
      sStack_4b8.x.n[1] = sStack_4b8.x.n[1] + uStack_410;
      sStack_4b8.x.n[2] = sStack_4b8.x.n[2] + uStack_408;
      sStack_4b8.x.n[3] = sStack_4b8.x.n[3] + uStack_400;
      sStack_4b8.x.n[4] = sStack_4b8.x.n[4] + uStack_3f8;
      sStack_4b8.x.normalized = 0;
      sStack_4b8.x.magnitude = iStack_3f0 + sStack_4b8.x.magnitude;
      secp256k1_fe_verify(&sStack_4b8.x);
      secp256k1_fe_verify(psVar1);
      uVar14 = (sStack_4b8.y.n[4] >> 0x30) * 0x1000003d1 + sStack_4b8.y.n[0];
      if (((uVar14 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar14 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar14 >> 0x34) + sStack_4b8.y.n[1];
        uVar12 = (uVar10 >> 0x34) + sStack_4b8.y.n[2];
        uVar16 = (uVar12 >> 0x34) + sStack_4b8.y.n[3];
        uVar17 = (uVar16 >> 0x34) + (sStack_4b8.y.n[4] & 0xffffffffffff);
        if ((((uVar10 | uVar14 | uVar12 | uVar16) & 0xfffffffffffff) != 0 || uVar17 != 0) &&
           ((uVar14 + 0x1000003d0 & uVar10 & uVar12 & uVar16 & (uVar17 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f5b4;
        secp256k1_fe_verify(&sStack_4b8.x);
        uVar14 = (sStack_4b8.x.n[4] >> 0x30) * 0x1000003d1 + sStack_4b8.x.n[0];
        if (((uVar14 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar14 & 0xfffffffffffff) != 0))
        goto LAB_0014f5b4;
        uVar10 = (uVar14 >> 0x34) + sStack_4b8.x.n[1];
        a_00 = (secp256k1_ge *)((uVar10 >> 0x34) + sStack_4b8.x.n[2]);
        r_00 = (secp256k1_ge *)(((ulong)a_00 >> 0x34) + sStack_4b8.x.n[3]);
        uVar12 = ((ulong)r_00 >> 0x34) + (sStack_4b8.x.n[4] & 0xffffffffffff);
        if ((((uVar10 | uVar14 | (ulong)a_00 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar12 != 0)
           && ((uVar14 + 0x1000003d0 & uVar10 & (ulong)a_00 & (ulong)r_00 &
               (uVar12 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014f5b4;
        goto LAB_0014f686;
      }
LAB_0014f5b4:
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)auStack_518,psVar1);
      psVar11 = (secp256k1_ge *)(auStack_518 + 0x30);
      if ((iVar5 != 0) &&
         (a_00 = &sStack_4b8, r_00 = psVar11,
         iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar11,&sStack_4b8.x), iVar5 != 0))
      goto LAB_0014f67c;
      secp256k1_fe_mul((secp256k1_fe *)auStack_518,(secp256k1_fe *)auStack_518,&sStack_4b8.x);
      secp256k1_fe_mul((secp256k1_fe *)psVar11,(secp256k1_fe *)psVar11,&sStack_4b8.y);
      r_00 = (secp256k1_ge *)auStack_518;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)auStack_518,(secp256k1_fe *)psVar11);
      if (iVar5 == 0) goto LAB_0014f677;
      psVar11 = &sStack_368;
      psVar15 = &sStack_3d8;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar15->x).n[0] = (psVar11->x).n[0];
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar21 * -2 + 1) * 8);
        psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      sStack_4b8._96_8_ = sStack_4b8._96_8_ + 0x40;
      if (sStack_4b8._96_8_ == 0x80000) {
        return;
      }
    }
    test_pre_g_table_cold_9();
LAB_0014f663:
    test_pre_g_table_cold_8();
LAB_0014f668:
    test_pre_g_table_cold_7();
LAB_0014f66d:
    test_pre_g_table_cold_6();
LAB_0014f672:
    test_pre_g_table_cold_5();
LAB_0014f677:
    test_pre_g_table_cold_4();
    a_00 = psVar11;
LAB_0014f67c:
    test_pre_g_table_cold_3();
LAB_0014f681:
    test_pre_g_table_cold_1();
LAB_0014f686:
    test_pre_g_table_cold_2();
  }
  test_pre_g_table_cold_10();
  secp256k1_scalar_verify((secp256k1_scalar *)a_00);
  auVar22._0_4_ = -(uint)((int)(a_00->x).n[2] == 0 && (int)(a_00->x).n[0] == 0);
  auVar22._4_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x14) == 0 && *(int *)((long)(a_00->x).n + 4) == 0);
  auVar22._8_4_ = -(uint)((int)(a_00->x).n[3] == 0 && (int)(a_00->x).n[1] == 0);
  auVar22._12_4_ =
       -(uint)(*(int *)((long)(a_00->x).n + 0x1c) == 0 && *(int *)((long)(a_00->x).n + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar22);
  if (iVar5 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)count)) {
      memset(r_00,0,(0x7f / (long)(int)count & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify((secp256k1_scalar *)a_00);
    uVar4 = (a_00->x).n[0];
    uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,0,count);
    *(uint32_t *)(r_00->x).n = uVar7 + (~(uint)uVar4 & 1);
    iVar5 = (int)(0x7f / (long)(int)count);
    uVar6 = iVar5 * count;
    uVar18 = 0x80 - uVar6;
    uVar14 = 0x7f / (long)(int)count & 0xffffffff;
    if (0 < iVar5) {
      lVar8 = 0;
      uVar10 = uVar14;
      do {
        uVar9 = count;
        if (lVar8 == 0) {
          uVar9 = uVar18;
        }
        uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar6,uVar9);
        if (uVar7 != 0) goto LAB_0014f765;
        *(undefined4 *)((long)(r_00->x).n + uVar10 * 4) = 0;
        uVar6 = uVar6 - count;
        lVar8 = lVar8 + 1;
        bVar20 = 1 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar20);
      uVar10 = 0;
LAB_0014f765:
      iVar5 = (int)uVar10;
    }
    if (0 < iVar5) {
      uVar10 = 1;
      uVar6 = count;
      do {
        uVar9 = count;
        if (uVar14 == uVar10) {
          uVar9 = uVar18;
        }
        uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_00,uVar6,uVar9);
        if ((uVar7 & 1) == 0) {
          piVar2 = (int *)((long)(r_00->x).n + uVar10 * 4 + -4);
          *piVar2 = *piVar2 + (-1 << ((byte)count & 0x1f));
          uVar7 = uVar7 | 1;
        }
        *(uint32_t *)((long)(r_00->x).n + uVar10 * 4) = uVar7;
        if ((1 < uVar10) &&
           (((iVar3 = *(int *)((long)(r_00->x).n + uVar10 * 4 + -4), iVar3 == 1 &&
             (*(int *)((long)(r_00->x).n + uVar10 * 4 + -8) < 0)) ||
            ((iVar3 == -1 && (0 < *(int *)((long)(r_00->x).n + uVar10 * 4 + -8))))))) {
          piVar2 = (int *)((long)(r_00->x).n + uVar10 * 4 + -8);
          *piVar2 = *piVar2 + ((uint)(iVar3 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)(r_00->x).n + uVar10 * 4 + -4) = 0;
        }
        uVar10 = uVar10 + 1;
        uVar6 = uVar6 + count;
      } while (iVar5 + 1 != uVar10);
    }
  }
  return;
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}